

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

uint32_t __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_2U,_true>_>::
findUnionLeft(NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_2U,_true>_>
              *this,uint32_t i,uint32_t size,interval<unsigned_long> *key)

{
  interval<unsigned_long> *piVar1;
  ulong *in_RCX;
  uint in_EDX;
  uint in_ESI;
  BranchNode<unsigned_long,_2U,_true> *in_RDI;
  interval<unsigned_long> curr;
  BranchNode<unsigned_long,_2U,_true> *self;
  uint local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (in_EDX <= local_14) {
      return in_EDX;
    }
    piVar1 = BranchNode<unsigned_long,_2U,_true>::keyAt(in_RDI,local_14);
    if (*in_RCX <= piVar1->left) break;
    if (*in_RCX <= piVar1->right + 1) {
      return local_14;
    }
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

uint32_t findUnionLeft(uint32_t i, uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(i <= size);
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);

        for (; i < size; i++) {
            // If we've found where we would insert this key as a new interval
            // based on its left value, stop and return that.
            auto curr = self.keyAt(i);
            if (curr.left >= key.left)
                return i;

            // Otherwise, if we've found an overlap, return it.
            if (curr.right + 1 >= key.left)
                return i;
        }

        return size;
    }